

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockUnix.cxx
# Opt level: O2

cmFileLockResult __thiscall cmFileLock::LockWithTimeout(cmFileLock *this,unsigned_long seconds)

{
  int iVar1;
  int *piVar2;
  cmFileLockResult cVar3;
  bool bVar4;
  
  while( true ) {
    iVar1 = LockFile(this,6,1);
    if (iVar1 != -1) {
      cVar3 = cmFileLockResult::MakeOk();
      return cVar3;
    }
    piVar2 = __errno_location();
    if ((*piVar2 != 0xb) && (*piVar2 != 0xd)) break;
    bVar4 = seconds == 0;
    seconds = seconds - 1;
    if (bVar4) {
      cVar3 = cmFileLockResult::MakeTimeout();
      return cVar3;
    }
    cmsys::SystemTools::Delay(1000);
  }
  cVar3 = cmFileLockResult::MakeSystem();
  return cVar3;
}

Assistant:

cmFileLockResult cmFileLock::LockWithTimeout(unsigned long seconds)
{
  while (true) {
    if (this->LockFile(F_SETLK, F_WRLCK) == -1) {
      if (errno != EACCES && errno != EAGAIN) {
        return cmFileLockResult::MakeSystem();
      }
    } else {
      return cmFileLockResult::MakeOk();
    }
    if (seconds == 0) {
      return cmFileLockResult::MakeTimeout();
    }
    --seconds;
    cmSystemTools::Delay(1000);
  }
}